

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O0

void do_move_forward_back
               (Am_Object *inter,Am_Object *widget,Am_Which_Sel_Direction dir,bool extend,
               Am_Object *command_obj)

{
  bool bVar1;
  Am_Value *pAVar2;
  ostream *poVar3;
  void *this;
  Am_Wrapper *pAVar4;
  Am_String local_130;
  Am_Value local_128;
  Am_Value local_118;
  Am_Value local_108;
  undefined1 local_f8 [8];
  Am_Value obj_value;
  Am_Object new_object;
  Am_Object local_d8;
  Am_Value_List local_d0;
  Am_Value_List local_c0;
  Am_Value_List local_b0;
  Am_Value_List local_a0;
  Am_String local_90;
  Am_String label;
  Am_Value_List old_value;
  Am_Value_List new_value;
  Am_Object local_60;
  Am_Object local_58 [3];
  undefined1 local_40 [8];
  Am_Value_List parts;
  Am_Object main_group;
  Am_Object *command_obj_local;
  bool extend_local;
  Am_Which_Sel_Direction dir_local;
  Am_Object *widget_local;
  Am_Object *inter_local;
  
  pAVar2 = Am_Object::Get(widget,0x193,0);
  Am_Object::Am_Object((Am_Object *)&parts.item,pAVar2);
  pAVar2 = Am_Object::Get((Am_Object *)&parts.item,0x82,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_40,pAVar2);
  bVar1 = Am_Value_List::Valid((Am_Value_List *)local_40);
  if (bVar1) {
    clear_multi_selections(widget);
    Am_Value_List::Am_Value_List((Am_Value_List *)&old_value.item);
    if (dir != Am_Sel_NONE) {
      pAVar2 = Am_Object::Get(widget,0x169,3);
      Am_Value_List::Am_Value_List((Am_Value_List *)&label,pAVar2);
      Am_String::Am_String(&local_90);
      switch(dir) {
      case Am_Sel_FORWARD:
        toward_end(&local_a0,(Am_Value_List *)local_40,SUB81(&label,0),false);
        Am_Value_List::operator=((Am_Value_List *)&old_value.item,&local_a0);
        Am_Value_List::~Am_Value_List(&local_a0);
        if (extend) {
          Am_String::operator=(&local_90,"Extend Selection Forward");
        }
        else {
          Am_String::operator=(&local_90,"Selection Forward");
        }
        break;
      case Am_SEL_BACKWARD:
        toward_beginning(&local_c0,(Am_Value_List *)local_40,SUB81(&label,0),false);
        Am_Value_List::operator=((Am_Value_List *)&old_value.item,&local_c0);
        Am_Value_List::~Am_Value_List(&local_c0);
        if (extend) {
          Am_String::operator=(&local_90,"Extend Selection Backward");
        }
        else {
          Am_String::operator=(&local_90,"Selection Backward");
        }
        break;
      case Am_Sel_HOME:
        toward_beginning(&local_d0,(Am_Value_List *)local_40,SUB81(&label,0),true);
        Am_Value_List::operator=((Am_Value_List *)&old_value.item,&local_d0);
        Am_Value_List::~Am_Value_List(&local_d0);
        if (extend) {
          Am_String::operator=(&local_90,"Extend Selection To Beginning");
        }
        else {
          Am_String::operator=(&local_90,"Select Beginning");
        }
        break;
      case Am_Sel_END:
        toward_end(&local_b0,(Am_Value_List *)local_40,SUB81(&label,0),true);
        Am_Value_List::operator=((Am_Value_List *)&old_value.item,&local_b0);
        Am_Value_List::~Am_Value_List(&local_b0);
        if (extend) {
          Am_String::operator=(&local_90,"Extend Selection To End");
        }
        else {
          Am_String::operator=(&local_90,"Select End");
        }
        break;
      default:
        poVar3 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
        poVar3 = std::operator<<(poVar3,"Bad direction ");
        this = (void *)std::ostream::operator<<(poVar3,dir);
        std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
        Am_Error();
      }
      bVar1 = Am_Value_List::Valid((Am_Value_List *)&old_value.item);
      if (bVar1) {
        Am_Value_List::End((Am_Value_List *)&old_value.item);
        pAVar2 = Am_Value_List::Get((Am_Value_List *)&old_value.item);
        Am_Object::Am_Object((Am_Object *)&obj_value.value,pAVar2);
        pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)&old_value.item);
        Am_Object::Set(widget,0x169,pAVar4,0);
        pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&obj_value.value);
        Am_Value::Am_Value((Am_Value *)local_f8,pAVar4);
        Am_Value::Am_Value(&local_108,(Am_Value *)local_f8);
        pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)&old_value.item);
        Am_Value::Am_Value(&local_118,pAVar4);
        pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)&label);
        Am_Value::Am_Value(&local_128,pAVar4);
        Am_String::Am_String(&local_130,&local_90);
        set_commands_for_sel
                  (command_obj,inter,widget,&local_108,&local_118,&local_128,true,&local_130,dir,
                   extend);
        Am_String::~Am_String(&local_130);
        Am_Value::~Am_Value(&local_128);
        Am_Value::~Am_Value(&local_118);
        Am_Value::~Am_Value(&local_108);
        Am_Value::~Am_Value((Am_Value *)local_f8);
        Am_Object::~Am_Object((Am_Object *)&obj_value.value);
      }
      else {
        Am_Object::Am_Object(&local_d8,&Am_No_Object);
        Am_Beep(&local_d8);
        Am_Object::~Am_Object(&local_d8);
        Am_Object::Am_Object(&new_object,inter);
        Am_Abort_Interactor(&new_object,true);
        Am_Object::~Am_Object(&new_object);
      }
      Am_String::~Am_String(&local_90);
      Am_Value_List::~Am_Value_List((Am_Value_List *)&label);
    }
    Am_Value_List::~Am_Value_List((Am_Value_List *)&old_value.item);
  }
  else {
    Am_Object::Am_Object(local_58,&Am_No_Object);
    Am_Beep(local_58);
    Am_Object::~Am_Object(local_58);
    Am_Object::Am_Object(&local_60,inter);
    Am_Abort_Interactor(&local_60,true);
    Am_Object::~Am_Object(&local_60);
  }
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_40);
  Am_Object::~Am_Object((Am_Object *)&parts.item);
  return;
}

Assistant:

void
do_move_forward_back(Am_Object &inter, Am_Object &widget,
                     Am_Which_Sel_Direction dir, bool extend,
                     Am_Object command_obj)
{
  Am_Object main_group = widget.Get(Am_OPERATES_ON);
  Am_Value_List parts = main_group.Get(Am_GRAPHICAL_PARTS);
  if (!parts.Valid()) {
    Am_Beep();                  // cannot move further
    Am_Abort_Interactor(inter); //make sure not queued for undo
    return;                     //no parts, can't move forward or back
  }
  clear_multi_selections(widget);
  Am_Value_List new_value;
  if (dir == Am_Sel_NONE)
    return;

  Am_Value_List old_value = widget.Get(Am_VALUE, Am_RETURN_ZERO_ON_ERROR);
  Am_String label;
  switch (dir) {
  case Am_Sel_FORWARD:
    new_value = toward_end(parts, old_value, false, extend);
    if (extend)
      label = "Extend Selection Forward";
    else
      label = "Selection Forward";
    break;
  case Am_Sel_END:
    new_value = toward_end(parts, old_value, true, extend);
    if (extend)
      label = "Extend Selection To End";
    else
      label = "Select End";
    break;
  case Am_SEL_BACKWARD:
    new_value = toward_beginning(parts, old_value, false, extend);
    if (extend)
      label = "Extend Selection Backward";
    else
      label = "Selection Backward";
    break;
  case Am_Sel_HOME:
    new_value = toward_beginning(parts, old_value, true, extend);
    if (extend)
      label = "Extend Selection To Beginning";
    else
      label = "Select Beginning";
    break;
  default:
    Am_ERROR("Bad direction " << (int)dir);
  }
  if (!new_value.Valid()) {
    Am_Beep();                  // cannot move further
    Am_Abort_Interactor(inter); //make sure not queued for undo
    return;
  }
  new_value.End();
  Am_Object new_object = new_value.Get();
  Am_INTER_TRACE_PRINT(widget, "Selection handle "
                                   << widget << label
                                   << " new value = " << new_value);

  widget.Set(Am_VALUE, new_value);
  Am_Value obj_value = Am_Value(new_object);
  set_commands_for_sel(command_obj, inter, widget, obj_value,
                       Am_Value(new_value), Am_Value(old_value), true, label,
                       dir, extend);
}